

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O0

void __thiscall
QtPrivate::QMovableArrayOps<QMimeMagicRule>::emplace<QMimeMagicRule>
          (QMovableArrayOps<QMimeMagicRule> *this,qsizetype i,QMimeMagicRule *args)

{
  bool bVar1;
  qsizetype qVar2;
  QMimeMagicRule *in_RSI;
  Inserter *in_RDI;
  long in_FS_OFFSET;
  GrowthPosition pos;
  bool growsAtBegin;
  bool detach;
  QMimeMagicRule tmp;
  QMimeMagicRule *in_stack_fffffffffffffef8;
  QMimeMagicRule *in_stack_ffffffffffffff00;
  undefined7 in_stack_ffffffffffffff08;
  undefined1 in_stack_ffffffffffffff0f;
  undefined1 uVar3;
  GrowthPosition in_stack_ffffffffffffff1c;
  QArrayDataPointer<QMimeMagicRule> *in_stack_ffffffffffffff20;
  Inserter local_b8;
  undefined1 local_90 [136];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  bVar1 = QArrayDataPointer<QMimeMagicRule>::needsDetach
                    ((QArrayDataPointer<QMimeMagicRule> *)in_stack_ffffffffffffff00);
  if (!bVar1) {
    if ((in_RSI == in_RDI->displaceTo) &&
       (qVar2 = QArrayDataPointer<QMimeMagicRule>::freeSpaceAtEnd
                          ((QArrayDataPointer<QMimeMagicRule> *)
                           CONCAT17(in_stack_ffffffffffffff0f,in_stack_ffffffffffffff08)),
       qVar2 != 0)) {
      QArrayDataPointer<QMimeMagicRule>::end
                ((QArrayDataPointer<QMimeMagicRule> *)in_stack_ffffffffffffff00);
      QMimeMagicRule::QMimeMagicRule(in_stack_ffffffffffffff00,in_stack_fffffffffffffef8);
      in_RDI->displaceTo = (QMimeMagicRule *)((long)&(in_RDI->displaceTo->m_subMatches).d.d + 1);
      goto LAB_00913915;
    }
    if ((in_RSI == (QMimeMagicRule *)0x0) &&
       (qVar2 = QArrayDataPointer<QMimeMagicRule>::freeSpaceAtBegin
                          ((QArrayDataPointer<QMimeMagicRule> *)
                           CONCAT17(in_stack_ffffffffffffff0f,in_stack_ffffffffffffff08)),
       qVar2 != 0)) {
      QArrayDataPointer<QMimeMagicRule>::begin((QArrayDataPointer<QMimeMagicRule> *)0x9137aa);
      QMimeMagicRule::QMimeMagicRule(in_stack_ffffffffffffff00,in_stack_fffffffffffffef8);
      in_RDI->displaceFrom = in_RDI->displaceFrom + -1;
      in_RDI->displaceTo = (QMimeMagicRule *)((long)&(in_RDI->displaceTo->m_subMatches).d.d + 1);
      goto LAB_00913915;
    }
  }
  memset(local_90,0xaa,0x88);
  QMimeMagicRule::QMimeMagicRule(in_stack_ffffffffffffff00,in_stack_fffffffffffffef8);
  bVar1 = in_RDI->displaceTo != (QMimeMagicRule *)0x0;
  uVar3 = bVar1 && in_RSI == (QMimeMagicRule *)0x0;
  QArrayDataPointer<QMimeMagicRule>::detachAndGrow
            (in_stack_ffffffffffffff20,in_stack_ffffffffffffff1c,(qsizetype)in_RDI,
             (QMimeMagicRule **)CONCAT17(uVar3,in_stack_ffffffffffffff08),
             (QArrayDataPointer<QMimeMagicRule> *)in_stack_ffffffffffffff00);
  if (bVar1 && in_RSI == (QMimeMagicRule *)0x0) {
    QArrayDataPointer<QMimeMagicRule>::begin((QArrayDataPointer<QMimeMagicRule> *)0x91386b);
    QMimeMagicRule::QMimeMagicRule(in_stack_ffffffffffffff00,in_stack_fffffffffffffef8);
    in_RDI->displaceFrom = in_RDI->displaceFrom + -1;
    in_RDI->displaceTo = (QMimeMagicRule *)((long)&(in_RDI->displaceTo->m_subMatches).d.d + 1);
  }
  else {
    Inserter::Inserter(in_RDI,(QArrayDataPointer<QMimeMagicRule> *)
                              CONCAT17(uVar3,in_stack_ffffffffffffff08),
                       (qsizetype)in_stack_ffffffffffffff00,(qsizetype)in_stack_fffffffffffffef8);
    Inserter::insertOne((Inserter *)in_stack_ffffffffffffff00,in_stack_fffffffffffffef8);
    Inserter::~Inserter(&local_b8);
  }
  QMimeMagicRule::~QMimeMagicRule(in_stack_ffffffffffffff00);
LAB_00913915:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void emplace(qsizetype i, Args &&... args)
    {
        bool detach = this->needsDetach();
        if (!detach) {
            if (i == this->size && this->freeSpaceAtEnd()) {
                new (this->end()) T(std::forward<Args>(args)...);
                ++this->size;
                return;
            }
            if (i == 0 && this->freeSpaceAtBegin()) {
                new (this->begin() - 1) T(std::forward<Args>(args)...);
                --this->ptr;
                ++this->size;
                return;
            }
        }
        T tmp(std::forward<Args>(args)...);
        const bool growsAtBegin = this->size != 0 && i == 0;
        const auto pos = growsAtBegin ? Data::GrowsAtBeginning : Data::GrowsAtEnd;

        this->detachAndGrow(pos, 1, nullptr, nullptr);
        if (growsAtBegin) {
            Q_ASSERT(this->freeSpaceAtBegin());
            new (this->begin() - 1) T(std::move(tmp));
            --this->ptr;
            ++this->size;
        } else {
            Inserter(this, i, 1).insertOne(std::move(tmp));
        }
    }